

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorcerer.c
# Opt level: O2

void gravity_well_explode(ROOM_INDEX_DATA *room,ROOM_AFFECT_DATA *af)

{
  CHAR_DATA *ch;
  CHAR_DATA *pCVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  CHAR_DATA *ch_00;
  OBJ_DATA **obj;
  int idam;
  
  ch = af->owner;
  affect_strip_area(room->area,(int)gsn_gravity_well);
  obj = &object_list;
  do {
    obj = &((OBJ_DATA *)obj)->next->next;
    if ((OBJ_DATA *)obj == (OBJ_DATA *)0x0) {
      return;
    }
  } while ((((OBJ_DATA *)obj)->item_type != 0x26) ||
          (((OBJ_DATA *)obj)->in_room != room ||
           ((OBJ_DATA *)obj)->in_room == (ROOM_INDEX_DATA *)0x0));
  send_to_char("You lose control of your gravity well and it ruptures violently!\n\r",ch);
  pCVar1 = ((OBJ_DATA *)obj)->in_room->people;
  if (pCVar1 != (CHAR_DATA *)0x0) {
    act("The gravity well flares brightly and explodes, sending waves of force rippling outward!",
        pCVar1,(void *)0x0,(void *)0x0,4);
  }
  extract_obj((OBJ_DATA *)obj);
  affect_strip_room(room,(int)gsn_gravity_well);
  pCVar1 = room->people;
  bVar4 = true;
LAB_00356a5e:
  do {
    ch_00 = pCVar1;
    if (ch_00 == (CHAR_DATA *)0x0) {
      return;
    }
    pCVar1 = ch_00->next_in_room;
    bVar2 = is_npc(ch_00);
  } while ((!bVar2) && (bVar2 = is_safe_new(ch,ch_00,false), bVar2));
  iVar3 = dice(0x14,0x14);
  idam = iVar3 / 2;
  if (ch != ch_00) {
    idam = iVar3;
  }
  if (ch->in_room != (ROOM_INDEX_DATA *)0x0) goto code_r0x00356ab1;
  char_to_room(ch,room);
  damage_new(ch,ch_00,idam,(int)af->type,0xb,true,false,0,1,"the violent explosion*");
  goto LAB_00356b29;
code_r0x00356ab1:
  damage_new(ch,ch_00,idam,(int)af->type,0xb,true,false,0,1,"the violent explosion*");
  bVar2 = !bVar4;
  bVar4 = true;
  if (bVar2) {
LAB_00356b29:
    char_from_room(ch);
    bVar4 = false;
  }
  goto LAB_00356a5e;
}

Assistant:

void gravity_well_explode(ROOM_INDEX_DATA *room, ROOM_AFFECT_DATA *af)
{
	CHAR_DATA *victim, *v_next, *ch = af->owner;
	OBJ_DATA *well;
	int dam;
	bool wasinroom = true;

	affect_strip_area(room->area, gsn_gravity_well);

	for (well = object_list; well != nullptr; well = well->next)
	{
		if (well->item_type == ITEM_GRAVITYWELL && well->in_room && well->in_room == room)
			break;
	}

	if (!well)
		return;

	send_to_char("You lose control of your gravity well and it ruptures violently!\n\r", ch);

	if (well->in_room->people)
		act("The gravity well flares brightly and explodes, sending waves of force rippling outward!", well->in_room->people, 0, 0, TO_ALL);

	extract_obj(well);
	affect_strip_room(room, gsn_gravity_well);

	for (victim = room->people; victim != nullptr; victim = v_next)
	{
		v_next = victim->next_in_room;

		if (!is_npc(victim) && is_safe_new(ch, victim, false))
			continue;

		dam = dice(20, 20);

		if (ch == victim)
			dam /= 2;

		if (!ch->in_room)
		{
			char_to_room(ch, room);
			wasinroom = false;
		}

		damage_new(ch, victim, dam, af->type, DAM_ENERGY, true, HIT_UNBLOCKABLE, HIT_NOADD, HIT_NOMULT, "the violent explosion*");

		if (!wasinroom)
			char_from_room(ch);
	}
}